

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# section.cpp
# Opt level: O0

bool check_for_intercept(int *bounding_box,int *axis_type,int *x1,int *y1,int *x2,int *y2)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double y_intercept;
  double x_intercept;
  double c;
  double m;
  int *y2_local;
  int *x2_local;
  int *y1_local;
  int *x1_local;
  int *axis_type_local;
  int *bounding_box_local;
  
  if (((((*x1 < *bounding_box) || (bounding_box[2] < *x1)) || (*y1 < bounding_box[1])) ||
      (bounding_box[3] < *y1)) &&
     (((*x2 < *bounding_box || (bounding_box[2] < *x2)) ||
      ((*y2 < bounding_box[1] || (bounding_box[3] < *y2)))))) {
    if (*axis_type == 1) {
      if (((*y1 < bounding_box[1]) || (bounding_box[3] < *y1)) ||
         ((*bounding_box < *x1 || (*x2 < *bounding_box)))) {
        bounding_box_local._7_1_ = false;
      }
      else {
        bounding_box_local._7_1_ = true;
      }
    }
    else if (*axis_type == 3) {
      if ((((bounding_box[1] < *y1) || (*y2 < bounding_box[1])) || (*x1 < *bounding_box)) ||
         (bounding_box[2] < *x1)) {
        bounding_box_local._7_1_ = false;
      }
      else {
        bounding_box_local._7_1_ = true;
      }
    }
    else {
      dVar1 = ((double)*y2 - (double)*y1) / ((double)*x2 - (double)*x1);
      dVar2 = -dVar1 * (double)*x1 + (double)*y1;
      dVar3 = round(((double)bounding_box[1] - dVar2) / dVar1);
      if ((dVar3 < (double)*bounding_box) || ((double)bounding_box[2] < dVar3)) {
        dVar3 = round(dVar1 * (double)bounding_box[2] + dVar2);
        if ((dVar3 < (double)bounding_box[1]) || ((double)bounding_box[3] < dVar3)) {
          dVar3 = round(((double)bounding_box[3] - dVar2) / dVar1);
          if ((dVar3 < (double)*bounding_box) || ((double)bounding_box[2] < dVar3)) {
            dVar1 = round(dVar1 * (double)*bounding_box + dVar2);
            if ((dVar1 < (double)bounding_box[1]) || ((double)bounding_box[3] < dVar1)) {
              bounding_box_local._7_1_ = false;
            }
            else {
              bounding_box_local._7_1_ = true;
            }
          }
          else {
            bounding_box_local._7_1_ = true;
          }
        }
        else {
          bounding_box_local._7_1_ = true;
        }
      }
      else {
        bounding_box_local._7_1_ = true;
      }
    }
  }
  else {
    bounding_box_local._7_1_ = true;
  }
  return bounding_box_local._7_1_;
}

Assistant:

bool check_for_intercept(int *bounding_box, int &axis_type, int &x1, int &y1,
                         int &x2, int &y2)
{
  // If either point lies inside the box immediately return true
  if (((x1 >= bounding_box[0]) && (x1 <= bounding_box[2]) &&
       (y1 >= bounding_box[1]) && (y1 <= bounding_box[3])) ||
      ((x2 >= bounding_box[0]) && (x2 <= bounding_box[2]) &&
       (y2 >= bounding_box[1]) && (y2 <= bounding_box[3]))) {
    return true;
  }
  // At this stage, neither point lies inside the bounding box.
  switch (axis_type) {
  case 1: // Horizontal
    if ((y1 >= bounding_box[1]) && (y1 <= bounding_box[3]) &&
        (x1 <= bounding_box[0]) && (x2 >= bounding_box[0])) {
      return true;
    } else {
      return false;
    }
    break;
  case 3: // Vertical
    if ((y1 <= bounding_box[1]) && (y2 >= bounding_box[1]) &&
        (x1 >= bounding_box[0]) && (x1 <= bounding_box[2])) {
      return true;
    } else {
      return false;
    }
    break;
  default: // Angled
    double m = ((double)y2 - (double)y1) / ((double)x2 - (double)x1);
    double c = (double)y1 - m * (double)x1;
    // Bottom line of bounding box
    double x_intercept = round(((double)bounding_box[1] - c) / m);
    if ((x_intercept >= (double)bounding_box[0]) &&
        (x_intercept <= (double)bounding_box[2])) {
      return true;
    }
    // Right line of bounding box
    double y_intercept = round(m * (double)bounding_box[2] + c);
    if ((y_intercept >= (double)bounding_box[1]) &&
        (y_intercept <= (double)bounding_box[3])) {
      return true;
    }
    // Top line of bounding box
    x_intercept = round(((double)bounding_box[3] - c) / m);
    if ((x_intercept >= (double)bounding_box[0]) &&
        (x_intercept <= (double)bounding_box[2])) {
      return true;
    }
    // Left line of bounding box
    y_intercept = round(m * (double)bounding_box[0] + c);
    if ((y_intercept >= (double)bounding_box[1]) &&
        (y_intercept <= (double)bounding_box[3])) {
      return true;
    }
    // None of the above 4 lines had cross sections therefore this point was
    // reached.
    return false;
    break;
  }
}